

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O2

vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
* acquire_locks(vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                *__return_storage_ptr__,IteratorPopCommand *cmd,DatabaseSnapshot *snap)

{
  string_view iterator;
  initializer_list<std::variant<DatasetLock,_IteratorLock>_> __l;
  allocator_type local_61;
  IteratorLock local_60;
  _Variant_storage<false,_DatasetLock,_IteratorLock> local_40;
  
  iterator._M_str = (cmd->iterator_id)._M_dataplus._M_p;
  iterator._M_len = (cmd->iterator_id)._M_string_length;
  IteratorLock::IteratorLock(&local_60,iterator);
  std::variant<DatasetLock,IteratorLock>::variant<IteratorLock,void,void,IteratorLock,void>
            ((variant<DatasetLock,IteratorLock> *)&local_40,&local_60);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(__return_storage_ptr__,__l,&local_61);
  std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::~_Variant_storage
            (&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<DatabaseLock> acquire_locks(
    const IteratorPopCommand &cmd,
    [[maybe_unused]] const DatabaseSnapshot *snap) {
    return {IteratorLock(cmd.get_iterator_id())};
}